

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

vm_date_ext * vm_date_ext::alloc_ext(CVmObjDate *self)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,self);
  return (vm_date_ext *)CONCAT44(extraout_var,iVar1);
}

Assistant:

vm_date_ext *vm_date_ext::alloc_ext(VMG_ CVmObjDate *self)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_date_ext);

    /* allocate the memory */
    vm_date_ext *ext = (vm_date_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* return the new extension */
    return ext;
}